

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::SharedDtor(KNearestNeighborsClassifier *this)

{
  if (this != (KNearestNeighborsClassifier *)&_KNearestNeighborsClassifier_default_instance_) {
    if (this->nearestneighborsindex_ != (NearestNeighborsIndex *)0x0) {
      (*(this->nearestneighborsindex_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->numberofneighbors_ != (Int64Parameter *)0x0) {
      (*(this->numberofneighbors_->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  if (this->_oneof_case_[0] != 0) {
    clear_ClassLabels(this);
  }
  if (this->_oneof_case_[1] != 0) {
    clear_DefaultClassLabel(this);
  }
  if (this->_oneof_case_[2] != 0) {
    clear_WeightingScheme(this);
    return;
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::SharedDtor() {
  if (this != internal_default_instance()) {
    delete nearestneighborsindex_;
  }
  if (this != internal_default_instance()) {
    delete numberofneighbors_;
  }
  if (has_ClassLabels()) {
    clear_ClassLabels();
  }
  if (has_DefaultClassLabel()) {
    clear_DefaultClassLabel();
  }
  if (has_WeightingScheme()) {
    clear_WeightingScheme();
  }
}